

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O1

int xmllintShellDir(xmllintShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  int iVar1;
  size_t sVar2;
  
  if (arg == (char *)0x0) {
    sVar2 = fwrite("NULL\n",5,1,(FILE *)ctxt->output);
    return (int)sVar2;
  }
  iVar1 = *(int *)(arg + 8);
  if (iVar1 != 2) {
    if ((iVar1 != 0xd) && (iVar1 != 9)) {
      iVar1 = xmlDebugDumpOneNode(ctxt->output,arg,0);
      return iVar1;
    }
    iVar1 = xmlDebugDumpDocumentHead(ctxt->output);
    return iVar1;
  }
  iVar1 = xmlDebugDumpAttr(ctxt->output,arg,0);
  return iVar1;
}

Assistant:

static int
xmllintShellDir(xmllintShellCtxtPtr ctxt ATTRIBUTE_UNUSED,
            char *arg ATTRIBUTE_UNUSED, xmlNodePtr node,
            xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
#ifdef LIBXML_DEBUG_ENABLED
    if ((node->type == XML_DOCUMENT_NODE) ||
        (node->type == XML_HTML_DOCUMENT_NODE)) {
        xmlDebugDumpDocumentHead(ctxt->output, (xmlDocPtr) node);
    } else if (node->type == XML_ATTRIBUTE_NODE) {
        xmlDebugDumpAttr(ctxt->output, (xmlAttrPtr) node, 0);
    } else {
        xmlDebugDumpOneNode(ctxt->output, node, 0);
    }
#endif
    return (0);
}